

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theory_data.cpp
# Opt level: O2

TheoryTerm * __thiscall Potassco::TheoryData::getTerm(TheoryData *this,Id_t id)

{
  Data *pDVar1;
  ulong uVar2;
  
  uVar2 = (ulong)id;
  pDVar1 = this->data_;
  if ((id < (uint)((pDVar1->terms).top >> 3)) &&
     (pDVar1 = (Data *)(pDVar1->terms).mem.beg_,
     (&(pDVar1->atoms).mem.beg_)[uVar2] != (void *)0xffffffffffffffff)) {
    return (TheoryTerm *)(&(pDVar1->atoms).mem.beg_ + uVar2);
  }
  fail(-2,"const TheoryTerm &Potassco::TheoryData::getTerm(Id_t) const",0x145,"hasTerm(id)",
       "Unknown term \'%u\'",uVar2,(ulong)pDVar1 & 0xffffffff00000000);
}

Assistant:

const TheoryTerm& TheoryData::getTerm(Id_t id) const {
	POTASSCO_REQUIRE(hasTerm(id), "Unknown term '%u'", unsigned(id));
	return terms()[id];
}